

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O1

char __thiscall
cs_impl::cni_helper<char_(*)(const_cs::numeric_&),_char_(*)(const_cs::numeric_&)>::_call<0>
          (cni_helper<char_(*)(const_cs::numeric_&),_char_(*)(const_cs::numeric_&)> *this,
          vector *args,sequence<0> *param_2)

{
  char cVar1;
  numeric *pnVar2;
  
  pnVar2 = try_convert_and_check<const_cs::numeric_&,_const_cs::numeric_&,_cs::numeric,_0UL>::
           convert((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                   super__Vector_impl_data._M_start);
  if ((this->mFunc).super__Function_base._M_manager != (_Manager_type)0x0) {
    cVar1 = (*(this->mFunc)._M_invoker)((_Any_data *)this,pnVar2);
    return cVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}